

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void statPush(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long *plVar1;
  int iVar2;
  Mem *pMem;
  void *pvVar3;
  i64 iVar4;
  long lVar5;
  long lVar6;
  ulong val;
  
  pvVar3 = sqlite3_value_blob(*argv);
  iVar4 = sqlite3VdbeIntValue(argv[1]);
  lVar6 = *(long *)((long)pvVar3 + 0x10);
  if (lVar6 == 0) {
    lVar6 = 0;
  }
  else {
    iVar2 = *(int *)((long)pvVar3 + 0x1c);
    if ((int)iVar4 < iVar2) {
      lVar6 = *(long *)((long)pvVar3 + 0x28);
      lVar5 = (long)(int)iVar4;
      do {
        plVar1 = (long *)(lVar6 + lVar5 * 8);
        *plVar1 = *plVar1 + 1;
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
      lVar6 = *(long *)((long)pvVar3 + 0x10);
    }
  }
  *(ulong *)((long)pvVar3 + 0x10) = lVar6 + 1U;
  if (((long)*(int *)((long)pvVar3 + 0x18) != 0) &&
     (((ulong)*(byte *)((long)pvVar3 + 0x24) + 1) * (long)*(int *)((long)pvVar3 + 0x18) < lVar6 + 1U
     )) {
    *(byte *)((long)pvVar3 + 0x24) = *(byte *)((long)pvVar3 + 0x24) + 1;
    val = (ulong)(**(long **)((long)pvVar3 + 0x28) != 0);
    pMem = context->pOut;
    if ((pMem->flags & 0x9000) != 0) {
      vdbeReleaseAndSetInt64(pMem,val);
      return;
    }
    (pMem->u).i = val;
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void statPush(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;

  /* The three function arguments */
  StatAccum *p = (StatAccum*)sqlite3_value_blob(argv[0]);
  int iChng = sqlite3_value_int(argv[1]);

  UNUSED_PARAMETER( argc );
  UNUSED_PARAMETER( context );
  assert( p->nCol>0 );
  assert( iChng<p->nCol );

  if( p->nRow==0 ){
    /* This is the first call to this function. Do initialization. */
#ifdef SQLITE_ENABLE_STAT4
    for(i=0; i<p->nCol; i++) p->current.anEq[i] = 1;
#endif
  }else{
    /* Second and subsequent calls get processed here */
#ifdef SQLITE_ENABLE_STAT4
    if( p->mxSample ) samplePushPrevious(p, iChng);
#endif

    /* Update anDLt[], anLt[] and anEq[] to reflect the values that apply
    ** to the current row of the index. */
#ifdef SQLITE_ENABLE_STAT4
    for(i=0; i<iChng; i++){
      p->current.anEq[i]++;
    }
#endif
    for(i=iChng; i<p->nCol; i++){
      p->current.anDLt[i]++;
#ifdef SQLITE_ENABLE_STAT4
      if( p->mxSample ) p->current.anLt[i] += p->current.anEq[i];
      p->current.anEq[i] = 1;
#endif
    }
  }

  p->nRow++;
#ifdef SQLITE_ENABLE_STAT4
  if( p->mxSample ){
    tRowcnt nLt;
    if( sqlite3_value_type(argv[2])==SQLITE_INTEGER ){
      sampleSetRowidInt64(p->db, &p->current, sqlite3_value_int64(argv[2]));
    }else{
      sampleSetRowid(p->db, &p->current, sqlite3_value_bytes(argv[2]),
                                         sqlite3_value_blob(argv[2]));
    }
    p->current.iHash = p->iPrn = p->iPrn*1103515245 + 12345;

    nLt = p->current.anLt[p->nCol-1];
    /* Check if this is to be a periodic sample. If so, add it. */
    if( (nLt/p->nPSample)!=(nLt+1)/p->nPSample ){
      p->current.isPSample = 1;
      p->current.iCol = 0;
      sampleInsert(p, &p->current, p->nCol-1);
      p->current.isPSample = 0;
    }

    /* Update the aBest[] array. */
    for(i=0; i<(p->nCol-1); i++){
      p->current.iCol = i;
      if( i>=iChng || sampleIsBetterPost(p, &p->current, &p->aBest[i]) ){
        sampleCopy(p, &p->aBest[i], &p->current);
      }
    }
  }else
#endif
  if( p->nLimit && p->nRow>(tRowcnt)p->nLimit*(p->nSkipAhead+1) ){
    p->nSkipAhead++;
    sqlite3_result_int(context, p->current.anDLt[0]>0);
  }
}